

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> * __thiscall
anon_unknown.dwarf_1f36a0::CliqueRunner::unpermute_and_finish
          (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
           *__return_storage_ptr__,CliqueRunner *this,vector<int,_std::allocator<int>_> *v)

{
  int *piVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  int *w;
  int *piVar6;
  bool local_2e;
  bool local_2d;
  int local_2c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar6 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar6 != piVar1; piVar6 = piVar6 + 1) {
    local_2d = true;
    std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::emplace_back<int&,bool>
              ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
               __return_storage_ptr__,
               (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar6,&local_2d);
  }
  local_2c = 0;
  do {
    if (this->size <= local_2c) {
      return __return_storage_ptr__;
    }
    ppVar2 = (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)ppVar2 - (long)ppVar3;
    for (lVar5 = lVar4 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
      if (ppVar3->first == local_2c) goto LAB_00144852;
      if (ppVar3[1].first == local_2c) {
        ppVar3 = ppVar3 + 1;
        goto LAB_00144852;
      }
      if (ppVar3[2].first == local_2c) {
        ppVar3 = ppVar3 + 2;
        goto LAB_00144852;
      }
      if (ppVar3[3].first == local_2c) {
        ppVar3 = ppVar3 + 3;
        goto LAB_00144852;
      }
      ppVar3 = ppVar3 + 4;
      lVar4 = lVar4 + -0x20;
    }
    lVar4 = lVar4 >> 3;
    if (lVar4 == 1) {
LAB_0014483a:
      if (ppVar3->first != local_2c) {
        ppVar3 = ppVar2;
      }
LAB_00144852:
      if (ppVar2 == ppVar3) goto LAB_00144857;
    }
    else {
      if (lVar4 == 2) {
LAB_00144832:
        if (ppVar3->first != local_2c) {
          ppVar3 = ppVar3 + 1;
          goto LAB_0014483a;
        }
        goto LAB_00144852;
      }
      if (lVar4 == 3) {
        if (ppVar3->first != local_2c) {
          ppVar3 = ppVar3 + 1;
          goto LAB_00144832;
        }
        goto LAB_00144852;
      }
LAB_00144857:
      local_2e = false;
      std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::emplace_back<int&,bool>
                ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                 __return_storage_ptr__,&local_2c,&local_2e);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

auto unpermute_and_finish(
            vector<int> & v) -> vector<pair<int, bool>>
        {
            vector<pair<int, bool>> result;
            for (auto & w : v)
                result.emplace_back(order[w], true);
            for (int w = 0; w < size; ++w)
                if (result.end() == find_if(result.begin(), result.end(), [&](auto & x) { return x.first == w; }))
                    result.emplace_back(w, false);
            return result;
        }